

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::AddInterfaceDepends
          (cmComputeTargetDepends *this,int depender_index,cmLinkItem *dependee_name,string *config,
          set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted)

{
  cmGeneratorTarget *pcVar1;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  TargetType TVar4;
  reference ppcVar5;
  pair<std::_Rb_tree_const_iterator<cmLinkItem>,_bool> pVar6;
  cmListFileBacktrace local_108;
  cmLinkItem local_f8;
  _Base_ptr local_b8;
  undefined1 local_b0;
  cmListFileBacktrace local_98;
  cmLinkItem local_80;
  cmGeneratorTarget *local_40;
  cmGeneratorTarget *dependee;
  cmGeneratorTarget *depender;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted_local;
  string *config_local;
  cmLinkItem *dependee_name_local;
  cmComputeTargetDepends *pcStack_10;
  int depender_index_local;
  cmComputeTargetDepends *this_local;
  
  depender = (cmGeneratorTarget *)emitted;
  emitted_local = (set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)config;
  config_local = &dependee_name->String;
  dependee_name_local._4_4_ = depender_index;
  pcStack_10 = this;
  ppcVar5 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator[](&this->Targets,(long)depender_index);
  dependee = *ppcVar5;
  local_40 = *(cmGeneratorTarget **)(config_local + 1);
  if (local_40 != (cmGeneratorTarget *)0x0) {
    TVar4 = cmGeneratorTarget::GetType(local_40);
    if (TVar4 == EXECUTABLE) {
      bVar3 = cmGeneratorTarget::IsExecutableWithExports(local_40);
      if (!bVar3) {
        local_40 = (cmGeneratorTarget *)0x0;
      }
    }
  }
  pcVar2 = depender;
  pcVar1 = dependee;
  if (local_40 != (cmGeneratorTarget *)0x0) {
    local_98.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_98.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_98);
    cmLinkItem::cmLinkItem(&local_80,pcVar1,false,&local_98);
    pVar6 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                      ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)pcVar2
                       ,&local_80);
    local_b8 = (_Base_ptr)pVar6.first._M_node;
    local_b0 = pVar6.second;
    cmLinkItem::~cmLinkItem(&local_80);
    cmListFileBacktrace::~cmListFileBacktrace(&local_98);
    pcVar2 = depender;
    pcVar1 = dependee;
    local_108.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_108.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmListFileBacktrace::cmListFileBacktrace(&local_108);
    cmLinkItem::cmLinkItem(&local_f8,pcVar1,true,&local_108);
    std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
              ((set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)pcVar2,
               &local_f8);
    cmLinkItem::~cmLinkItem(&local_f8);
    cmListFileBacktrace::~cmListFileBacktrace(&local_108);
    AddInterfaceDepends(this,dependee_name_local._4_4_,local_40,
                        (cmListFileBacktrace *)&config_local[1].field_2,(string *)emitted_local,
                        (set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *)
                        depender);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddInterfaceDepends(
  int depender_index, cmLinkItem const& dependee_name,
  const std::string& config, std::set<cmLinkItem>& emitted)
{
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  cmGeneratorTarget const* dependee = dependee_name.Target;
  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if (dependee && dependee->GetType() == cmStateEnums::EXECUTABLE &&
      !dependee->IsExecutableWithExports()) {
    dependee = nullptr;
  }

  if (dependee) {
    // A target should not depend on itself.
    emitted.insert(cmLinkItem(depender, false, cmListFileBacktrace()));
    emitted.insert(cmLinkItem(depender, true, cmListFileBacktrace()));
    this->AddInterfaceDepends(depender_index, dependee,
                              dependee_name.Backtrace, config, emitted);
  }
}